

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_PanidQuery_Test::~InterpreterTestSuite_PC_PanidQuery_Test
          (InterpreterTestSuite_PC_PanidQuery_Test *this)

{
  InterpreterTestSuite_PC_PanidQuery_Test *this_local;
  
  ~InterpreterTestSuite_PC_PanidQuery_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_PanidQuery)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, PanIdQuery(_, _, _)).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("panid query 1 2 1234::5678");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}